

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

char * Json::strnpbrk(char *s,char *accept,size_t n)

{
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar1;
  char *a;
  int c;
  char *cur;
  char *end;
  char *local_40;
  char *local_30;
  
  if ((in_RDI != (char *)0x0) || (bVar1 = false, in_RDX == 0)) {
    bVar1 = in_RSI != (char *)0x0;
  }
  if (bVar1) {
    local_30 = in_RDI;
    do {
      if (in_RDI + in_RDX <= local_30) {
        return (char *)0x0;
      }
      for (local_40 = in_RSI; *local_40 != '\0'; local_40 = local_40 + 1) {
        if (*local_40 == *local_30) {
          return local_30;
        }
      }
      local_30 = local_30 + 1;
    } while( true );
  }
  __assert_fail("(s || !n) && accept",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                ,0xcb,"const char *Json::strnpbrk(const char *, const char *, size_t)");
}

Assistant:

static char const* strnpbrk(char const* s, char const* accept, size_t n) {
  assert((s || !n) && accept);

  char const* const end = s + n;
  for (char const* cur = s; cur < end; ++cur) {
    int const c = *cur;
    for (char const* a = accept; *a; ++a) {
      if (*a == c) {
        return cur;
      }
    }
  }
  return NULL;
}